

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O1

void mpiabi_reduce_scatter_block_
               (void *sendbuf,void *recvbuf,MPIABI_Fint *recvcount,MPIABI_Fint *datatype,
               MPIABI_Fint *op,MPIABI_Fint *comm,MPIABI_Fint *ierror)

{
  mpi_reduce_scatter_block_();
  return;
}

Assistant:

void mpiabi_reduce_scatter_block_(
  const void * sendbuf,
  void * recvbuf,
  const MPIABI_Fint * recvcount,
  const MPIABI_Fint * datatype,
  const MPIABI_Fint * op,
  const MPIABI_Fint * comm,
  MPIABI_Fint * ierror
) {
  return mpi_reduce_scatter_block_(
    sendbuf,
    recvbuf,
    recvcount,
    datatype,
    op,
    comm,
    ierror
  );
}